

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

void spell_word_of_command(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *pCVar3;
  size_t sVar4;
  char *pcVar5;
  CHAR_DATA *in_RDX;
  int in_ESI;
  CHAR_DATA *victim;
  AFFECT_DATA af;
  char buf [4608];
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffc948;
  undefined4 in_stack_ffffffffffffc950;
  undefined4 in_stack_ffffffffffffc954;
  CHAR_DATA *in_stack_ffffffffffffc958;
  undefined4 in_stack_ffffffffffffc960;
  int in_stack_ffffffffffffc964;
  CHAR_DATA *in_stack_ffffffffffffc970;
  CHAR_DATA *in_stack_ffffffffffffc978;
  undefined4 in_stack_ffffffffffffc980;
  int in_stack_ffffffffffffc984;
  undefined2 in_stack_ffffffffffffc988;
  undefined2 in_stack_ffffffffffffc98a;
  undefined2 in_stack_ffffffffffffc98c;
  undefined2 in_stack_ffffffffffffc98e;
  int in_stack_ffffffffffffc990;
  char local_3628 [412];
  int in_stack_ffffffffffffcb74;
  CHAR_DATA *in_stack_ffffffffffffcb78;
  CHAR_DATA *in_stack_ffffffffffffcb80;
  char *in_stack_ffffffffffffdb50;
  CHAR_DATA *in_stack_ffffffffffffdb58;
  char local_2428 [4608];
  char local_1228;
  CHAR_DATA *local_10;
  int local_8;
  
  local_10 = in_RDX;
  local_8 = in_ESI;
  target_name = one_argument((char *)CONCAT44(in_stack_ffffffffffffc954,in_stack_ffffffffffffc950),
                             (char *)in_stack_ffffffffffffc948);
  target_name = one_argument((char *)CONCAT44(in_stack_ffffffffffffc954,in_stack_ffffffffffffc950),
                             (char *)in_stack_ffffffffffffc948);
  if (((local_1228 == '\0') || (local_2428[0] == '\0')) || (*target_name == '\0')) {
    local_10->wait = 0;
    local_10->mana = local_10->mana + 0x96;
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 in_stack_ffffffffffffc958);
  }
  else {
    pCVar3 = get_char_room(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
    if (pCVar3 == (CHAR_DATA *)0x0) {
      local_10->wait = 0;
      local_10->mana = local_10->mana + 0x96;
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                   in_stack_ffffffffffffc958);
    }
    else if (local_10 == pCVar3) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                   in_stack_ffffffffffffc958);
    }
    else {
      bVar1 = is_immortal(in_stack_ffffffffffffc948);
      if ((!bVar1) || (bVar1 = is_immortal(in_stack_ffffffffffffc948), bVar1)) {
        bVar1 = is_safe_new(in_stack_ffffffffffffc978,in_stack_ffffffffffffc970,
                            SUB81((ulong)pCVar3 >> 0x38,0));
        if (!bVar1) {
          bVar1 = is_npc(in_stack_ffffffffffffc948);
          if (bVar1) {
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                         in_stack_ffffffffffffc958);
          }
          else {
            bVar1 = is_affected(local_10,(int)gsn_word_of_command);
            if (bVar1) {
              send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                           in_stack_ffffffffffffc958);
            }
            else {
              bVar1 = is_immortal(in_stack_ffffffffffffc948);
              if (bVar1) {
                in_stack_ffffffffffffc964 = get_trust(in_stack_ffffffffffffc948);
                iVar2 = get_trust(in_stack_ffffffffffffc948);
                if (in_stack_ffffffffffffc964 < iVar2) {
                  send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960)
                               ,in_stack_ffffffffffffc958);
                  return;
                }
              }
              bVar1 = str_prefix((char *)in_stack_ffffffffffffc978,(char *)in_stack_ffffffffffffc970
                                );
              if (((bVar1) &&
                  (bVar1 = str_prefix((char *)in_stack_ffffffffffffc978,
                                      (char *)in_stack_ffffffffffffc970), bVar1)) &&
                 ((bVar1 = str_prefix((char *)in_stack_ffffffffffffc978,
                                      (char *)in_stack_ffffffffffffc970), bVar1 &&
                  (bVar1 = str_prefix((char *)in_stack_ffffffffffffc978,
                                      (char *)in_stack_ffffffffffffc970), bVar1)))) {
                iVar2 = local_8 + 0x14;
                get_curr_stat((CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffc984,in_stack_ffffffffffffc980),
                              (int)((ulong)in_stack_ffffffffffffc978 >> 0x20));
                bVar1 = saves_spell(in_stack_ffffffffffffc990,
                                    (CHAR_DATA *)
                                    CONCAT26(in_stack_ffffffffffffc98e,
                                             CONCAT24(in_stack_ffffffffffffc98c,
                                                      CONCAT22(in_stack_ffffffffffffc98a,
                                                               in_stack_ffffffffffffc988))),
                                    in_stack_ffffffffffffc984);
                if (bVar1) {
                  act((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                      in_stack_ffffffffffffc958,(void *)CONCAT44(iVar2,in_stack_ffffffffffffc950),
                      in_stack_ffffffffffffc948,0);
                  act((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                      in_stack_ffffffffffffc958,(void *)CONCAT44(iVar2,in_stack_ffffffffffffc950),
                      in_stack_ffffffffffffc948,0);
                  sprintf(local_3628,"Die, %s you sorcerous dog!",local_10->name);
                  do_myell((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                           (char *)in_stack_ffffffffffffc958,
                           (CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffc950));
                  multi_hit(in_stack_ffffffffffffcb80,in_stack_ffffffffffffcb78,
                            in_stack_ffffffffffffcb74);
                }
                else {
                  act((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                      in_stack_ffffffffffffc958,(void *)CONCAT44(iVar2,in_stack_ffffffffffffc950),
                      in_stack_ffffffffffffc948,0);
                  sVar4 = strlen(local_2428);
                  local_2428[sVar4] = '\0';
                  pcVar5 = palloc_string((char *)in_stack_ffffffffffffc978);
                  pCVar3->pcdata->command[0] = pcVar5;
                  pcVar5 = palloc_string((char *)in_stack_ffffffffffffc978);
                  pCVar3->pcdata->command[1] = pcVar5;
                  init_affect((AFFECT_DATA *)0x72dd36);
                  affect_to_char((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffc950),
                                 (AFFECT_DATA *)in_stack_ffffffffffffc948);
                }
              }
              else {
                send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                             in_stack_ffffffffffffc958);
                act((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                    in_stack_ffffffffffffc958,
                    (void *)CONCAT44(in_stack_ffffffffffffc954,in_stack_ffffffffffffc950),
                    in_stack_ffffffffffffc948,0);
                act((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                    in_stack_ffffffffffffc958,
                    (void *)CONCAT44(in_stack_ffffffffffffc954,in_stack_ffffffffffffc950),
                    in_stack_ffffffffffffc948,0);
                local_10->hit = local_10->hit / 2;
              }
            }
          }
        }
      }
      else {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                     in_stack_ffffffffffffc958);
      }
    }
  }
  return;
}

Assistant:

void spell_word_of_command(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg1[MSL], arg2[MSL], buf[MSL];
	AFFECT_DATA af;
	CHAR_DATA *victim;

	target_name = one_argument(target_name, arg1);
	target_name = one_argument(target_name, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0' || target_name[0] == '\0')
	{
		ch->wait = 0;
		ch->mana += 150;

		send_to_char("Syntax: cast 'word of command' <target> <command phrase> <action>\n\r", ch);
		return;
	}

	if ((victim = get_char_room(ch, arg1)) == nullptr)
	{
		ch->wait = 0;
		ch->mana += 150;

		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch == victim)
	{
		send_to_char("As persuasive as you are, you're unable to corrupt your own mind.\n\r", ch);
		return;
	}

	if (is_immortal(victim) && !is_immortal(ch))
	{
		send_to_char("Don't even think about it.\n\r", ch);
		return;
	}

	if (is_safe_new(ch, victim, true))
		return;

	if (is_npc(victim))
	{
		send_to_char("You cannot manipulate such a being's mind.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_word_of_command))
	{
		send_to_char("They already have a word of command implanted in their mind.\n\r", ch);
		return;
	}

	if (is_immortal(victim) && get_trust(ch) < get_trust(victim))
	{
		send_to_char("Don't do that.  No, really.  Don't.\n\r", ch);
		return;
	}

	if (!str_prefix(target_name, "delete")
		|| !str_prefix(target_name, "quit")
		|| !str_prefix(target_name, "pass")
		||
		!str_prefix(target_name, "pray"))
	{
		send_to_char("What the hell do you think you're doing?\n\r", ch);

		act("A bolt from the heavens smites you!", ch, 0, 0, TO_CHAR);
		act("A bolt from the heavens smites $n!", ch, 0, 0, TO_ROOM);

		ch->hit /= 2;
		return;
	}

	if (saves_spell(level + 20 - get_curr_stat(victim, STAT_INT), victim, DAM_CHARM))
	{
		act("$N's mind resists your word of command.", ch, 0, victim, TO_CHAR);
		act("You fend off a dark mental assault by $n!", ch, 0, victim, TO_VICT);

		sprintf(buf, "Die, %s you sorcerous dog!", ch->name);
		do_myell(victim, buf, ch);

		multi_hit(victim, ch, TYPE_UNDEFINED);
		return;
	}

	act("You successfully implant a word of command in $N's malleable mind.", ch, 0, victim, TO_CHAR);

	arg2[strlen(arg2)] = '\0';

	victim->pcdata->command[0] = palloc_string(arg2);
	victim->pcdata->command[1] = palloc_string(target_name);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_INVIS;
	af.type = gsn_word_of_command;
	af.owner = ch;
	af.level = level;
	af.location = 0;
	af.duration = -1;
	af.modifier = 0;
	af.tick_fun = 0;
	af.end_fun = 0;
	affect_to_char(victim, &af);
}